

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRead.cpp
# Opt level: O1

void __thiscall
stk::FileRead::FileRead
          (FileRead *this,string *fileName,bool typeRaw,uint nChannels,StkFormat format,
          StkFloat rate)

{
  pointer pcVar1;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  Stk::Stk(&this->super_Stk);
  (this->super_Stk)._vptr_Stk = (_func_int **)&PTR__FileRead_00116ca0;
  this->fd_ = (FILE *)0x0;
  pcVar1 = (fileName->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + fileName->_M_string_length);
  open(this,(char *)local_50,(uint)typeRaw,rate,(ulong)nChannels,format);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

FileRead :: FileRead( std::string fileName, bool typeRaw, unsigned int nChannels,
                      StkFormat format, StkFloat rate )
  : fd_(0)
{
  open( fileName, typeRaw, nChannels, format, rate );
}